

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O2

bool __thiscall
SListBase<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount>::EditingIterator::Next
          (EditingIterator *this)

{
  NodeBase *pNVar1;
  undefined4 *puVar2;
  SListBase<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount> *pSVar3;
  code *pcVar4;
  bool bVar5;
  NodeBase *pNVar6;
  SListBase<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount> *pSVar7;
  undefined8 *in_FS_OFFSET;
  
  pNVar6 = this->last;
  if (pNVar6 == (NodeBase *)0x0) {
    pNVar1 = (this->super_Iterator).current;
  }
  else {
    pNVar1 = (this->super_Iterator).current;
    if (pNVar6->next != pNVar1) goto LAB_0020c7d8;
  }
  pNVar6 = pNVar1;
  this->last = pNVar6;
  if (pNVar6 == (NodeBase *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                       ,0x76,"(current != nullptr)","current != nullptr");
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar2 = 0;
    pNVar6 = (this->super_Iterator).current;
  }
LAB_0020c7d8:
  pSVar3 = (SListBase<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount> *)pNVar6->next;
  bVar5 = pSVar3 != (this->super_Iterator).list;
  pSVar7 = (SListBase<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount> *)0x0;
  if (bVar5) {
    pSVar7 = pSVar3;
  }
  (this->super_Iterator).current = &pSVar7->super_SListNodeBase<Memory::NoCheckHeapAllocator>;
  return bVar5;
}

Assistant:

bool Next()
        {
            if (last != nullptr && last->Next() != this->current)
            {
                this->current = last;
            }
            else
            {
                last = this->current;
            }
            return Iterator::Next();
        }